

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

void __thiscall amrex::Amr::checkInput(Amr *this)

{
  ostringstream *this_00;
  pointer pGVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int i;
  long lVar7;
  int idim;
  long lVar8;
  long lVar9;
  long lVar10;
  char local_1b9;
  Print local_1b8;
  
  if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level < 0) {
    Error_host("checkInput: max_level not set");
    if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level < 0) goto LAB_004b99c6;
  }
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      uVar3 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.blocking_factor.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7].vect[lVar8];
      do {
        uVar5 = uVar3;
        if ((int)uVar5 < 1) break;
        uVar3 = uVar5 >> 1;
      } while ((uVar5 & 1) == 0);
      if (uVar5 != 1) {
        Error_host("Amr::checkInput: blocking_factor not power of 2");
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    iVar6 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
    bVar2 = lVar7 < iVar6;
    lVar7 = lVar7 + 1;
  } while (bVar2);
  if (0 < iVar6) {
    iVar6 = 0;
    do {
      iVar4 = AmrMesh::MaxRefRatio((AmrMesh *)this,iVar6);
      if (iVar4 < 2) {
        Error_host("Amr::checkInput: bad ref_ratios");
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level);
  }
LAB_004b99c6:
  pGVar1 = (this->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((((pGVar1->domain).bigend.vect[0] < (pGVar1->domain).smallend.vect[0]) ||
       (*(int *)((long)&(pGVar1->domain).bigend + 4) <
        *(int *)((long)&(pGVar1->domain).smallend + 4))) ||
      (*(int *)((long)&(pGVar1->domain).bigend + 8) < *(int *)((long)&(pGVar1->domain).smallend + 8)
      )) || (7 < (pGVar1->domain).btype.itype)) {
    Error_host("level 0 domain bad or not set");
  }
  lVar7 = 0;
  do {
    if (((*(int *)((long)&(pGVar1->domain).bigend + lVar7 * 4) -
         *(int *)((long)&(pGVar1->domain).smallend + lVar7 * 4)) + 1) %
        ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.blocking_factor.
         super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
         super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
         super__Vector_impl_data._M_start)->vect[lVar7] != 0) {
      Error_host("domain size not divisible by blocking_factor");
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  if (-1 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      lVar9 = 0;
      do {
        if ((*(byte *)((long)((this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_grid_size.
                              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              _M_impl.super__Vector_impl_data._M_start)->vect + lVar9 * 4 + lVar8) &
            1) != 0) {
          Error_host("max_grid_size is not even");
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      iVar6 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      lVar8 = lVar8 + 0xc;
      bVar2 = lVar7 < iVar6;
      lVar7 = lVar7 + 1;
    } while (bVar2);
    if (-1 < iVar6) {
      lVar8 = 0;
      lVar7 = 0;
      do {
        lVar10 = 3;
        lVar9 = lVar8;
        do {
          if (*(int *)((long)((this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_grid_size.
                              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              _M_impl.super__Vector_impl_data._M_start)->vect + lVar9) %
              *(int *)((long)((this->super_AmrCore).super_AmrMesh.super_AmrInfo.blocking_factor.
                              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              _M_impl.super__Vector_impl_data._M_start)->vect + lVar9) != 0) {
            Error_host("max_grid_size not divisible by blocking_factor");
          }
          lVar9 = lVar9 + 4;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
        lVar8 = lVar8 + 0xc;
        bVar2 = lVar7 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
        lVar7 = lVar7 + 1;
      } while (bVar2);
    }
  }
  pGVar1 = (this->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((((pGVar1->prob_domain).xhi[0] - (pGVar1->prob_domain).xlo[0] < 0.0) ||
      (*(Real *)((long)(pGVar1->prob_domain).xhi + 8) -
       *(Real *)((long)(pGVar1->prob_domain).xlo + 8) < 0.0)) ||
     (*(Real *)((long)(pGVar1->prob_domain).xhi + 0x10) -
      *(Real *)((long)(pGVar1->prob_domain).xlo + 0x10) < 0.0)) {
    Error_host("Amr::checkInput: bad physical problem size");
  }
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    local_1b8.os = OutStream();
    local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
    this_00 = &local_1b8.ss;
    local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Successfully read inputs file ... ",0x22);
    local_1b9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,&local_1b9,1);
    Print::~Print(&local_1b8);
  }
  return;
}

Assistant:

void
Amr::checkInput ()
{
    if (max_level < 0) {
        amrex::Error("checkInput: max_level not set");
    }
    //
    // Check that blocking_factor is a power of 2.
    //
    for (int i = 0; i <= max_level; i++)
    {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            int k = blocking_factor[i][idim];
            while ( k > 0 && (k%2 == 0) ) {
                k /= 2;
            }
            if (k != 1) {
                amrex::Error("Amr::checkInput: blocking_factor not power of 2");
            }
        }
    }
    //
    // Check level dependent values.
    //
    for (int i = 0; i < max_level; i++)
    {
        if (MaxRefRatio(i) < 2) {
            amrex::Error("Amr::checkInput: bad ref_ratios");
        }
    }
    const Box& domain = Geom(0).Domain();
    if (!domain.ok()) {
        amrex::Error("level 0 domain bad or not set");
    }
    //
    // Check that domain size is a multiple of blocking_factor[0].
    //
    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        int len = domain.length(i);
        if (len%blocking_factor[0][i] != 0) {
            amrex::Error("domain size not divisible by blocking_factor");
        }
    }
    //
    // Check that max_grid_size is even.
    //
    for (int i = 0; i <= max_level; i++)
    {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            if (max_grid_size[i][idim]%2 != 0) {
                amrex::Error("max_grid_size is not even");
            }
        }
    }

    //
    // Check that max_grid_size is a multiple of blocking_factor at every level.
    //
    for (int i = 0; i <= max_level; i++)
    {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            if (max_grid_size[i][idim]%blocking_factor[i][idim] != 0) {
                amrex::Error("max_grid_size not divisible by blocking_factor");
            }
        }
    }

    if( ! Geom(0).ProbDomain().ok()) {
        amrex::Error("Amr::checkInput: bad physical problem size");
    }

    if(verbose > 0) {
        amrex::Print() << "Successfully read inputs file ... " << '\n';
    }
}